

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndelLengthDistribution.cpp
# Opt level: O2

ostream * operator<<(ostream *os,IndelLengthDistribution *ild)

{
  uint uVar1;
  uint *__src;
  void *__src_00;
  long lVar2;
  size_type __n;
  pointer piVar3;
  uint *puVar4;
  size_t sVar5;
  void *__dest;
  size_t i;
  ulong uVar6;
  
  std::operator<<(os,'[');
  for (uVar6 = 0;
      piVar3 = (ild->phred_costs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(ild->phred_costs).super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_finish - (long)piVar3 >> 2);
      uVar6 = uVar6 + 1) {
    if (uVar6 != 0) {
      std::operator<<(os,',');
      piVar3 = (ild->phred_costs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    std::ostream::operator<<((ostream *)os,piVar3[uVar6]);
  }
  puVar4 = (uint *)0x5d;
  std::operator<<(os,']');
  __src = *(uint **)(os + 8);
  if (__src != *(uint **)(os + 0x10)) {
    uVar1 = *puVar4;
    *__src = uVar1;
    *(uint **)(os + 8) = __src + 1;
    return (ostream *)(ulong)uVar1;
  }
  __n = std::vector<int,_std::allocator<int>_>::_M_check_len
                  ((vector<int,_std::allocator<int>_> *)os,1,"vector::_M_realloc_insert");
  __src_00 = *(void **)os;
  lVar2 = *(long *)(os + 8);
  sVar5 = (long)__src - (long)__src_00;
  piVar3 = std::_Vector_base<int,_std::allocator<int>_>::_M_allocate
                     ((_Vector_base<int,_std::allocator<int>_> *)os,__n);
  *(uint *)((long)piVar3 + sVar5) = *puVar4;
  if (0 < (long)sVar5) {
    memmove(piVar3,__src_00,sVar5);
  }
  __dest = (void *)((long)piVar3 + sVar5 + 4);
  sVar5 = lVar2 - (long)__src;
  if (0 < (long)sVar5) {
    memmove(__dest,__src,sVar5);
  }
  if (__src_00 != (void *)0x0) {
    operator_delete(__src_00);
  }
  *(pointer *)os = piVar3;
  *(size_t *)(os + 8) = (long)__dest + sVar5;
  *(ostream **)(os + 0x10) = (ostream *)(piVar3 + __n);
  return (ostream *)(piVar3 + __n);
}

Assistant:

std::ostream& operator<<(std::ostream& os, const IndelLengthDistribution& ild) {
	os << '[';
	for (size_t i=0; i<ild.phred_costs.size(); ++i) {
		if (i>0) os << ',';
		os << ild.phred_costs[i];
	}
	os << ']';
}